

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_AddRepeatedMessage_Test::
~GeneratedMessageReflectionTest_AddRepeatedMessage_Test
          (GeneratedMessageReflectionTest_AddRepeatedMessage_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, AddRepeatedMessage) {
  unittest::TestAllTypes message;

  const Reflection* reflection = message.GetReflection();
  const Reflection* nested_reflection =
      unittest::TestAllTypes::NestedMessage::default_instance().GetReflection();

  const FieldDescriptor* nested_bb =
      unittest::TestAllTypes::NestedMessage::descriptor()->FindFieldByName(
          "bb");

  Message* nested =
      reflection->AddMessage(&message, F("repeated_nested_message"));
  nested_reflection->SetInt32(nested, nested_bb, 11);

  EXPECT_EQ(11, message.repeated_nested_message(0).bb());
}